

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knetfile.c
# Opt level: O1

int khttp_connect_file(knetFile *fp)

{
  int iVar1;
  int iVar2;
  char *__s;
  size_t sVar3;
  ssize_t sVar4;
  long lVar5;
  off_t oVar6;
  int *piVar7;
  off_t rest;
  ulong uVar8;
  size_t __n;
  char *p;
  char *pcStack_38;
  
  if (fp->fd != -1) {
    close(fp->fd);
  }
  iVar1 = socket_connect(fp->host,fp->port);
  fp->fd = iVar1;
  __s = (char *)calloc(0x10000,1);
  iVar1 = sprintf(__s,"GET %s HTTP/1.0\r\nHost: %s\r\n",fp->path,fp->http_host);
  iVar2 = sprintf(__s + iVar1,"Range: bytes=%lld-\r\n",fp->offset);
  (__s + (iVar2 + iVar1))[0] = '\r';
  (__s + (iVar2 + iVar1))[1] = '\n';
  __s[(long)(iVar2 + iVar1) + 2] = '\0';
  __n = (size_t)(iVar2 + 2 + iVar1);
  sVar3 = write(fp->fd,__s,__n);
  if (sVar3 != __n) {
    free(__s);
    return -1;
  }
  sVar4 = read(fp->fd,__s,1);
  if (sVar4 == 0) {
    *__s = '\0';
  }
  else {
    uVar8 = 0;
    do {
      if (((2 < uVar8) && (__s[uVar8] == '\n')) &&
         (iVar1 = strncmp(__s + (uVar8 - 3),"\r\n\r\n",4), iVar1 == 0)) break;
      lVar5 = uVar8 + 1;
      uVar8 = uVar8 + 1;
      sVar4 = read(fp->fd,__s + lVar5,1);
    } while (sVar4 != 0);
    __s[uVar8] = '\0';
    if (0xd < (uint)uVar8) {
      lVar5 = strtol(__s + 8,&pcStack_38,0);
      iVar1 = (int)lVar5;
      if (iVar1 == 0xce) {
LAB_001121d2:
        free(__s);
        fp->is_ready = 1;
        return 0;
      }
      if (iVar1 == 200) {
        lVar5 = fp->offset;
        if (0 < lVar5) {
          do {
            oVar6 = 0x10000;
            if (lVar5 < 0x10000) {
              oVar6 = lVar5;
            }
            oVar6 = my_netread(fp->fd,__s,oVar6);
            lVar5 = lVar5 - oVar6;
          } while (lVar5 != 0);
        }
        goto LAB_001121d2;
      }
      free(__s);
      close(fp->fd);
      switch(iVar1) {
      case 0x191:
      case 0x197:
        iVar2 = 1;
        break;
      case 0x192:
      case 0x195:
      case 0x196:
      case 0x199:
switchD_0011225a_caseD_192:
        iVar2 = 5;
        if (iVar1 - 400U < 100) {
          iVar2 = 0x16;
        }
        break;
      case 0x193:
        iVar2 = 0xd;
        break;
      case 0x194:
      case 0x19a:
        iVar2 = 2;
        break;
      case 0x198:
switchD_0011225a_caseD_198:
        iVar2 = 0x6e;
        break;
      default:
        if (iVar1 != 0x1f7) {
          if (iVar1 == 0x1f8) goto switchD_0011225a_caseD_198;
          goto switchD_0011225a_caseD_192;
        }
        iVar2 = 0xb;
      }
      piVar7 = __errno_location();
      *piVar7 = iVar2;
      goto LAB_00112201;
    }
  }
  free(__s);
  close(fp->fd);
LAB_00112201:
  fp->fd = -1;
  return -1;
}

Assistant:

int khttp_connect_file(knetFile *fp)
{
	int ret, l = 0;
	char *buf, *p;
	if (fp->fd != -1) netclose(fp->fd);
	fp->fd = socket_connect(fp->host, fp->port);
	buf = (char*)calloc(0x10000, 1); // FIXME: I am lazy... But in principle, 64KB should be large enough.
	l += sprintf(buf + l, "GET %s HTTP/1.0\r\nHost: %s\r\n", fp->path, fp->http_host);
    l += sprintf(buf + l, "Range: bytes=%lld-\r\n", (long long)fp->offset);
	l += sprintf(buf + l, "\r\n");
	if ( netwrite(fp->fd, buf, l) != l ) { free(buf); return -1; }
	l = 0;
	while (netread(fp->fd, buf + l, 1)) { // read HTTP header; FIXME: bad efficiency
		if (buf[l] == '\n' && l >= 3)
			if (strncmp(buf + l - 3, "\r\n\r\n", 4) == 0) break;
		++l;
	}
	buf[l] = 0;
	if (l < 14) { // prematured header
		free(buf);
		netclose(fp->fd);
		fp->fd = -1;
		return -1;
	}
	ret = strtol(buf + 8, &p, 0); // HTTP return code
	if (ret == 200 && fp->offset>0) { // 200 (complete result); then skip beginning of the file
		off_t rest = fp->offset;
		while (rest) {
			off_t l = rest < 0x10000? rest : 0x10000;
			rest -= my_netread(fp->fd, buf, l);
		}
	} else if (ret != 206 && ret != 200) {
		// failed to open file
		free(buf);
		netclose(fp->fd);
		switch (ret) {
		case 401: errno = EPERM; break;
		case 403: errno = EACCES; break;
		case 404: errno = ENOENT; break;
		case 407: errno = EPERM; break;
		case 408: errno = ETIMEDOUT; break;
		case 410: errno = ENOENT; break;
		case 503: errno = EAGAIN; break;
		case 504: errno = ETIMEDOUT; break;
		default:  errno = (ret >= 400 && ret < 500)? EINVAL : EIO; break;
		}
		fp->fd = -1;
		return -1;
	}
	free(buf);
	fp->is_ready = 1;
	return 0;
}